

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ON_SimpleArray<int> li;
  ON_SimpleArray<int> local_38;
  
  local_38._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_38.m_a = (int *)0x0;
  local_38.m_count = 0;
  local_38.m_capacity = 0;
  ON_SimpleArray<int>::operator=(&local_38,&F->m_li);
  if (local_38.m_count < 1) {
    bVar4 = false;
  }
  else {
    lVar5 = 0;
    bVar4 = false;
    do {
      iVar1 = local_38.m_a[lVar5];
      pOVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      if ((pOVar2[iVar1].m_loop_index == iVar1) && (bVar3 = RemoveSlits(this,pOVar2 + iVar1), bVar3)
         ) {
        bVar4 = true;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_38.m_count);
  }
  ON_SimpleArray<int>::~ON_SimpleArray(&local_38);
  return bVar4;
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepFace& F)

{
  int i;
  bool rc = false;
  ON_SimpleArray<int> li = F.m_li;
  for (i=0; i<li.Count(); i++){
    ON_BrepLoop& L = m_L[li[i]];
    if (L.m_loop_index != li[i]) 
      continue;
    if (RemoveSlits(L))
      rc = true;
  }
  return rc;
}